

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void reindexDatabases(Parse *pParse,char *zColl)

{
  sqlite3 *psVar1;
  Table *pTab;
  HashElem *k;
  sqlite3 *db;
  Db *pDStack_20;
  int iDb;
  Db *pDb;
  char *zColl_local;
  Parse *pParse_local;
  
  psVar1 = pParse->db;
  db._4_4_ = 0;
  pDStack_20 = psVar1->aDb;
  for (; db._4_4_ < psVar1->nDb; db._4_4_ = db._4_4_ + 1) {
    for (pTab = (Table *)(pDStack_20->pSchema->tblHash).first; pTab != (Table *)0x0;
        pTab = (Table *)pTab->zName) {
      reindexTable(pParse,(Table *)pTab->pIndex,zColl);
    }
    pDStack_20 = pDStack_20 + 1;
  }
  return;
}

Assistant:

static void reindexDatabases(Parse *pParse, char const *zColl){
  Db *pDb;                    /* A single database */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  HashElem *k;                /* For looping over tables in pDb */
  Table *pTab;                /* A table in the database */

  assert( sqlite3BtreeHoldsAllMutexes(db) );  /* Needed for schema access */
  for(iDb=0, pDb=db->aDb; iDb<db->nDb; iDb++, pDb++){
    assert( pDb!=0 );
    for(k=sqliteHashFirst(&pDb->pSchema->tblHash);  k; k=sqliteHashNext(k)){
      pTab = (Table*)sqliteHashData(k);
      reindexTable(pParse, pTab, zColl);
    }
  }
}